

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemMakeWriteable(Mem *pMem)

{
  int iVar1;
  long in_RDI;
  int rc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if ((*(ushort *)(in_RDI + 0x14) & 0x12) != 0) {
    if (((*(ushort *)(in_RDI + 0x14) & 0x400) != 0) &&
       (iVar1 = sqlite3VdbeMemExpandBlob
                          ((Mem *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)),
       iVar1 != 0)) {
      return 7;
    }
    if (((*(int *)(in_RDI + 0x20) == 0) || (*(long *)(in_RDI + 8) != *(long *)(in_RDI + 0x28))) &&
       (iVar1 = vdbeMemAddTerminator
                          ((Mem *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)),
       iVar1 != 0)) {
      return iVar1;
    }
  }
  *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) & 0xbfff;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemMakeWriteable(Mem *pMem){
  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  if( (pMem->flags & (MEM_Str|MEM_Blob))!=0 ){
    if( ExpandBlob(pMem) ) return SQLITE_NOMEM;
    if( pMem->szMalloc==0 || pMem->z!=pMem->zMalloc ){
      int rc = vdbeMemAddTerminator(pMem);
      if( rc ) return rc;
    }
  }
  pMem->flags &= ~MEM_Ephem;
#ifdef SQLITE_DEBUG
  pMem->pScopyFrom = 0;
#endif

  return SQLITE_OK;
}